

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::FinishParse
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  string *str;
  bool bVar1;
  pointer __p;
  string *in_R8;
  StringPiece str_00;
  StringPiece local_88;
  StringPiece local_78;
  StringPiece local_68;
  undefined1 local_58 [8];
  _Alloc_hider _Stack_50;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scratch;
  
  if (((this->stack_).c.
       super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
       (this->stack_).c.
       super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur) && ((this->leftover_)._M_string_length == 0)
     ) {
    Status::Status(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_30._M_head_impl = (string *)0x0;
  str = &this->leftover_;
  bVar1 = protobuf::internal::IsStructurallyValidUTF8(str);
  if (this->coerce_to_utf8_ == true && !bVar1) {
    __p = (pointer)operator_new(0x20);
    (__p->_M_dataplus)._M_p = (pointer)&__p->field_2;
    __p->_M_string_length = 0;
    (__p->field_2)._M_local_buf[0] = '\0';
    std::
    __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_30,__p);
    std::__cxx11::string::reserve((ulong)local_30._M_head_impl);
    StringPiece::StringPiece<std::allocator<char>>(&local_88,str);
    str_00.length_ = (stringpiece_ssize_type)&this->utf8_replacement_character_;
    str_00.ptr_ = (char *)local_88.length_;
    ReplaceInvalidCodePoints((converter *)local_88.ptr_,str_00,local_30._M_head_impl,in_R8);
    StringPiece::StringPiece<std::allocator<char>>((StringPiece *)local_58,local_30._M_head_impl);
    (this->json_).ptr_ = (char *)local_58;
    (this->json_).length_ = (stringpiece_ssize_type)_Stack_50._M_p;
    (this->p_).ptr_ = (char *)local_58;
    (this->p_).length_ = (stringpiece_ssize_type)_Stack_50._M_p;
  }
  else {
    StringPiece::StringPiece<std::allocator<char>>((StringPiece *)local_58,str);
    (this->json_).ptr_ = (char *)local_58;
    (this->json_).length_ = (stringpiece_ssize_type)_Stack_50._M_p;
    (this->p_).ptr_ = (char *)local_58;
    (this->p_).length_ = (stringpiece_ssize_type)_Stack_50._M_p;
    if (!bVar1) {
      StringPiece::StringPiece(&local_78,"Encountered non UTF-8 code points.");
      ReportFailure(__return_storage_ptr__,this,local_78);
      goto LAB_0032d633;
    }
  }
  this->finishing_ = true;
  RunParser(__return_storage_ptr__,this);
  if ((__return_storage_ptr__->error_code_ == OK) && (SkipWhitespace(this), (this->p_).length_ != 0)
     ) {
    StringPiece::StringPiece(&local_68,"Parsing terminated before end of input.");
    ReportFailure((Status *)local_58,this,local_68);
    Status::operator=(__return_storage_ptr__,(Status *)local_58);
    std::__cxx11::string::~string((string *)&_Stack_50);
  }
LAB_0032d633:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::FinishParse() {
  // If we do not expect anything and there is nothing left to parse we're all
  // done.
  if (stack_.empty() && leftover_.empty()) {
    return util::Status();
  }

  // Lifetime needs to last until RunParser returns, so keep this variable
  // outside of the coerce_to_utf8 block.
  std::unique_ptr<std::string> scratch;

  bool is_valid_utf8 = internal::IsStructurallyValidUTF8(leftover_);
  if (coerce_to_utf8_ && !is_valid_utf8) {
    scratch.reset(new std::string);
    scratch->reserve(leftover_.size() * utf8_replacement_character_.size());
    ReplaceInvalidCodePoints(leftover_, utf8_replacement_character_,
                             scratch.get());
    p_ = json_ = *scratch;
  } else {
    p_ = json_ = leftover_;
    if (!is_valid_utf8) {
      return ReportFailure("Encountered non UTF-8 code points.");
    }
  }

  // Parse the remainder in finishing mode, which reports errors for things like
  // unterminated strings or unknown tokens that would normally be retried.
  finishing_ = true;
  util::Status result = RunParser();
  if (result.ok()) {
    SkipWhitespace();
    if (!p_.empty()) {
      result = ReportFailure("Parsing terminated before end of input.");
    }
  }
  return result;
}